

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O0

int __thiscall
cmsys::SystemInformationImplementation::GetProcessorCacheXSize
          (SystemInformationImplementation *this,long dwCacheID)

{
  long dwCacheID_local;
  SystemInformationImplementation *this_local;
  
  if (dwCacheID == 0x8000) {
    this_local._4_4_ = (this->Features).L1CacheSize;
  }
  else if (dwCacheID == 0x10000) {
    this_local._4_4_ = (this->Features).L2CacheSize;
  }
  else if (dwCacheID == 0x20000) {
    this_local._4_4_ = (this->Features).L3CacheSize;
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int SystemInformationImplementation::GetProcessorCacheXSize(
  long int dwCacheID) const
{
  switch (dwCacheID) {
    case SystemInformation::CPU_FEATURE_L1CACHE:
      return this->Features.L1CacheSize;
    case SystemInformation::CPU_FEATURE_L2CACHE:
      return this->Features.L2CacheSize;
    case SystemInformation::CPU_FEATURE_L3CACHE:
      return this->Features.L3CacheSize;
  }
  return -1;
}